

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::TestAny::ByteSizeLong(TestAny *this)

{
  RepeatedPtrField<google::protobuf::Any> *this_00;
  long lVar1;
  anon_union_56_1_493b367e_for_TestAny_3 aVar2;
  void **ppvVar3;
  const_iterator cVar4;
  size_t sVar5;
  ulong uVar6;
  string *value;
  size_t sVar7;
  
  sVar7 = (size_t)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.repeated_any_value_;
  ppvVar3 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar4 = google::protobuf::RepeatedPtrField<google::protobuf::Any>::end(this_00);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::Any>
                      ((Any *)*ppvVar3);
    sVar7 = sVar7 + sVar5;
  }
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x7) != (undefined1  [56])0x0) {
    if ((((undefined1  [56])aVar2 & (undefined1  [56])0x1) != (undefined1  [56])0x0) &&
       (value = (string *)
                ((ulong)(this->field_0)._impl_.text_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
       value->_M_string_length != 0)) {
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(value);
      sVar7 = sVar7 + sVar5 + 1;
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      sVar5 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::Any>
                        ((this->field_0)._impl_.any_value_);
      sVar7 = sVar7 + sVar5 + 1;
    }
    if ((((undefined1  [56])aVar2 & (undefined1  [56])0x4) != (undefined1  [56])0x0) &&
       (uVar6 = (ulong)(this->field_0)._impl_.int32_value_, uVar6 != 0)) {
      uVar6 = uVar6 | 1;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t TestAny::ByteSizeLong() const {
  const TestAny& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestAny)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.Any repeated_any_value = 3;
    {
      total_size += 1UL * this_._internal_repeated_any_value_size();
      for (const auto& msg : this_._internal_repeated_any_value()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string text = 4;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_text().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_text());
      }
    }
    // .google.protobuf.Any any_value = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.any_value_);
    }
    // int32 int32_value = 1;
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (this_._internal_int32_value() != 0) {
        total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
            this_._internal_int32_value());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}